

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlFragCoordXYZCaseInstance *this)

{
  TextureFormat TVar1;
  bool bVar2;
  int i;
  long lVar3;
  int y;
  uint z;
  float fVar4;
  float fVar5;
  Vec3 scaledFC;
  Vec3 fragCoord;
  Vec4 resultColor;
  deUint16 indices [6];
  Vec3 scale;
  UVec2 viewportSize;
  float local_f0;
  uint uStack_ec;
  uint local_e8;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  ConstPixelBufferAccess local_d0;
  TestStatus *local_a8;
  float local_9c [3];
  undefined1 local_90 [36];
  undefined4 local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  uint local_34;
  
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  local_d4 = (float)local_38;
  local_e0 = (float)(int)local_34;
  local_90._28_4_ = 1.0 / local_d4;
  local_90._32_4_ = 1.0 / local_e0;
  local_6c = 0x3f800000;
  local_90._16_4_ = 0x10002;
  local_90._20_4_ = 3;
  local_90._24_4_ = 0x20001;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  z = 0;
  ShaderRenderCaseInstance::addUniform
            (&this->super_ShaderRenderCaseInstance,0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0xc,
             local_90 + 0x1c);
  local_d0.m_format.order = 0x3e000000;
  local_d0.m_format.type = 0x3e800000;
  local_d0.m_size.m_data[0] = 0x3f000000;
  local_d0.m_size.m_data[1] = 0x3f800000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,4,2,(deUint16 *)(local_90 + 0x10),
             (Vec4 *)&local_d0);
  bVar2 = 0 < (int)local_34;
  if (0 < (int)local_34) {
    local_a8 = __return_storage_ptr__;
    do {
      if (0 < local_38) {
        local_d8 = ((float)(int)(~z + local_34) + 0.5) / local_e0;
        local_dc = (float)(int)z + 0.5;
        y = 0;
        do {
          local_9c[0] = (float)y + 0.5;
          local_9c[1] = local_dc;
          local_9c[2] = (((float)y + 0.5) / local_d4 + local_d8) * 0.5;
          local_e8 = 0;
          _local_f0 = 0;
          lVar3 = 0;
          do {
            (&local_f0)[lVar3] = local_9c[lVar3] * *(float *)(local_90 + lVar3 * 4 + 0x1c);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_48 = ZEXT416((uint)local_f0);
          local_58 = ZEXT416(uStack_ec);
          local_68 = ZEXT416(local_e8);
          tcu::TextureLevel::getAccess
                    (&local_d0,&(this->super_ShaderRenderCaseInstance).m_resultImage);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_90,(int)&local_d0,y,z);
          fVar5 = (float)local_48._0_4_ - (float)local_90._0_4_;
          fVar4 = -fVar5;
          if (-fVar5 <= fVar5) {
            fVar4 = fVar5;
          }
          if (1e-05 < fVar4) {
LAB_00579a63:
            TVar1 = (TextureFormat)(local_d0.m_size.m_data + 2);
            local_d0.m_format = TVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Image mismatch","")
            ;
            __return_storage_ptr__ = local_a8;
            local_a8->m_code = QP_TEST_RESULT_FAIL;
            (local_a8->m_description)._M_dataplus._M_p = (pointer)&(local_a8->m_description).field_2
            ;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8->m_description,local_d0.m_format,
                       (undefined1 *)(local_d0.m_size.m_data._0_8_ + (long)local_d0.m_format));
            if (local_d0.m_format != TVar1) {
              operator_delete((void *)local_d0.m_format,local_d0._16_8_ + 1);
            }
            if (bVar2) {
              return __return_storage_ptr__;
            }
            goto LAB_00579acc;
          }
          fVar5 = (float)local_58._0_4_ - (float)local_90._4_4_;
          fVar4 = -fVar5;
          if (-fVar5 <= fVar5) {
            fVar4 = fVar5;
          }
          if (1e-05 < fVar4) goto LAB_00579a63;
          fVar5 = (float)local_68._0_4_ - (float)local_90._8_4_;
          fVar4 = -fVar5;
          if (-fVar5 <= fVar5) {
            fVar4 = fVar5;
          }
          if (1e-05 < fVar4) goto LAB_00579a63;
          y = y + 1;
        } while (y != local_38);
      }
      z = z + 1;
      bVar2 = (int)z < (int)local_34;
      __return_storage_ptr__ = local_a8;
    } while (z != local_34);
  }
LAB_00579acc:
  TVar1 = (TextureFormat)(local_d0.m_size.m_data + 2);
  local_d0.m_format = TVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Result image matches reference","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_d0.m_format,
             (undefined1 *)(local_d0.m_size.m_data._0_8_ + (long)local_d0.m_format));
  if (local_d0.m_format != TVar1) {
    operator_delete((void *)local_d0.m_format,local_d0._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinGlFragCoordXYZCaseInstance::iterate (void)
{
	const UVec2		viewportSize	= getViewportSize();
	const int		width			= viewportSize.x();
	const int		height			= viewportSize.y();
	const tcu::Vec3	scale			(1.f / float(width), 1.f / float(height), 1.0f);
	const float		precision		= 0.00001f;
	const deUint16	indices[6]		=
	{
		2, 1, 3,
		0, 1, 2,
	};

	setup();
	addUniform(0, VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, scale);

	render(4, 2, indices);

	// Reference image
	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const float	xf			= (float(x) + .5f) / float(width);
			const float	yf			= (float(height - y - 1) + .5f) / float(height);
			const float	z			= (xf + yf) / 2.0f;
			const Vec3	fragCoord	(float(x) + .5f, float(y) + .5f, z);
			const Vec3	scaledFC	= fragCoord*scale;
			const Vec4	color		(scaledFC.x(), scaledFC.y(), scaledFC.z(), 1.0f);
			const Vec4	resultColor	= getResultImage().getAccess().getPixel(x, y);

			if (de::abs(color.x() - resultColor.x()) > precision ||
				de::abs(color.y() - resultColor.y()) > precision ||
				de::abs(color.z() - resultColor.z()) > precision)
			return TestStatus::fail("Image mismatch");
		}
	}

	return TestStatus::pass("Result image matches reference");
}